

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_calculate_buffer_size_in_frames_from_descriptor
                    (ma_device_descriptor *pDescriptor,ma_uint32 nativeSampleRate,
                    ma_performance_profile performanceProfile)

{
  ulong uVar1;
  ma_uint32 mVar2;
  
  if (pDescriptor == (ma_device_descriptor *)0x0) {
    return 0;
  }
  if (nativeSampleRate == 0) {
    nativeSampleRate = pDescriptor->sampleRate;
  }
  mVar2 = 48000;
  if (nativeSampleRate != 0) {
    mVar2 = nativeSampleRate;
  }
  if (pDescriptor->periodSizeInFrames != 0) {
    return pDescriptor->periodSizeInFrames;
  }
  if (pDescriptor->periodSizeInMilliseconds == 0) {
    if (performanceProfile == ma_performance_profile_low_latency) {
      uVar1 = (ulong)(mVar2 * 10);
    }
    else {
      uVar1 = (ulong)(mVar2 * 100);
    }
  }
  else {
    uVar1 = (ulong)(pDescriptor->periodSizeInMilliseconds * mVar2);
  }
  return (ma_uint32)(uVar1 / 1000);
}

Assistant:

MA_API ma_uint32 ma_calculate_buffer_size_in_frames_from_descriptor(const ma_device_descriptor* pDescriptor, ma_uint32 nativeSampleRate, ma_performance_profile performanceProfile)
{
    if (pDescriptor == NULL) {
        return 0;
    }

    /*
    We must have a non-0 native sample rate, but some backends don't allow retrieval of this at the
    time when the size of the buffer needs to be determined. In this case we need to just take a best
    guess and move on. We'll try using the sample rate in pDescriptor first. If that's not set we'll
    just fall back to MA_DEFAULT_SAMPLE_RATE.
    */
    if (nativeSampleRate == 0) {
        nativeSampleRate = pDescriptor->sampleRate;
    }
    if (nativeSampleRate == 0) {
        nativeSampleRate = MA_DEFAULT_SAMPLE_RATE;
    }

    MA_ASSERT(nativeSampleRate != 0);

    if (pDescriptor->periodSizeInFrames == 0) {
        if (pDescriptor->periodSizeInMilliseconds == 0) {
            if (performanceProfile == ma_performance_profile_low_latency) {
                return ma_calculate_buffer_size_in_frames_from_milliseconds(MA_DEFAULT_PERIOD_SIZE_IN_MILLISECONDS_LOW_LATENCY, nativeSampleRate);
            } else {
                return ma_calculate_buffer_size_in_frames_from_milliseconds(MA_DEFAULT_PERIOD_SIZE_IN_MILLISECONDS_CONSERVATIVE, nativeSampleRate);
            }
        } else {
            return ma_calculate_buffer_size_in_frames_from_milliseconds(pDescriptor->periodSizeInMilliseconds, nativeSampleRate);
        }
    } else {
        return pDescriptor->periodSizeInFrames;
    }
}